

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addConstraint
          (OptimalControlProblem *this,
          shared_ptr<iDynTree::optimalcontrol::LinearConstraint> *newConstraint)

{
  element_type *this_00;
  bool bVar1;
  string *__args_1;
  shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup> dummyGroup;
  __shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_60 [32];
  TimeRange local_40;
  
  this_00 = (newConstraint->
            super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  if (this_00 == (element_type *)0x0) {
    iDynTree::reportError("OptimalControlProblem","addConstraint","Invalid constraint pointer.");
    return false;
  }
  __args_1 = Constraint::name_abi_cxx11_(&this_00->super_Constraint);
  local_40.m_initTime =
       (double)Constraint::constraintSize
                         (&((newConstraint->
                            super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->super_Constraint);
  std::
  make_shared<iDynTree::optimalcontrol::ConstraintsGroup,std::__cxx11::string_const&,unsigned_long>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
             (unsigned_long *)__args_1);
  if ((ConstraintsGroup *)local_60._0_8_ == (ConstraintsGroup *)0x0) {
    iDynTree::reportError("OptimalControlProblem","addConstraint","Failed in adding constraint.");
  }
  else {
    std::__shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_70,
                 &newConstraint->
                  super___shared_ptr<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2>
                );
    TimeRange::AnyTime();
    bVar1 = ConstraintsGroup::addConstraint
                      ((ConstraintsGroup *)local_60._0_8_,
                       (shared_ptr<iDynTree::optimalcontrol::LinearConstraint> *)&local_70,&local_40
                      );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    if (bVar1) {
      std::__shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2>
                    *)(local_60 + 0x10),
                   (__shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2>
                    *)local_60);
      bVar1 = addGroupOfConstraints
                        (this,(shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup> *)
                              (local_60 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x18));
      goto LAB_0017d9e6;
    }
  }
  bVar1 = false;
LAB_0017d9e6:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  return bVar1;
}

Assistant:

bool OptimalControlProblem::addConstraint(std::shared_ptr<LinearConstraint> newConstraint)
        {
            if (!newConstraint){
                reportError("OptimalControlProblem", "addConstraint", "Invalid constraint pointer.");
                return false;
            }

            std::shared_ptr<ConstraintsGroup> dummyGroup =
                    std::make_shared<ConstraintsGroup>(newConstraint->name(),newConstraint->constraintSize());

            if(!dummyGroup){
                reportError("OptimalControlProblem", "addConstraint", "Failed in adding constraint.");
                return false;
            }

            if(!(dummyGroup->addConstraint(newConstraint, TimeRange::AnyTime()))){ //here is important to pass a LinearConstraint pointer
                return false;
            }
            return addGroupOfConstraints(dummyGroup);
        }